

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmVariableWatchCommand.cxx
# Opt level: O3

void anon_unknown.dwarf_e4117d::cmVariableWatchCommandVariableAccessed
               (string *variable,int access_type,void *client_data,char *newValue,cmMakefile *mf)

{
  uint *puVar1;
  pointer pcVar2;
  bool bVar3;
  string *psVar4;
  size_t sVar5;
  char *pcVar6;
  long lVar7;
  long *plVar8;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<cmListFileArgument> __l;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string accessString;
  string stack;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> newLFFArgs;
  cmExecutionStatus status;
  undefined1 local_301;
  uint *local_300;
  char *local_2f8;
  uint local_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  pointer local_2e0;
  pointer local_2d8;
  undefined1 local_2d0 [16];
  uint *local_2c0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_2b8;
  uint local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined1 *local_2a0;
  long *local_298;
  undefined8 local_290;
  undefined1 local_288;
  undefined7 uStack_287;
  undefined8 uStack_280;
  uint *local_278;
  undefined8 local_270;
  uint local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  pointer local_258;
  pointer local_250;
  undefined1 local_248 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  long local_228 [2];
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_218;
  cmListFileFunction local_1f8;
  cmMakefile *local_1e0;
  string local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  undefined1 local_198 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_180;
  char *local_170;
  undefined1 local_168 [24];
  char *pcStack_150;
  size_t local_148;
  char *local_140;
  uint *local_138;
  char *local_130;
  uint local_128 [2];
  undefined4 uStack_120;
  undefined4 uStack_11c;
  undefined4 local_118;
  undefined8 local_110;
  uint *local_108;
  undefined8 local_100;
  uint local_f8 [2];
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 local_e8;
  undefined8 local_e0;
  long *local_d8;
  undefined8 local_d0;
  long local_c8;
  undefined8 uStack_c0;
  undefined4 local_b8;
  undefined8 local_b0;
  string local_a0;
  undefined8 local_80;
  char *local_78;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_70;
  bool local_50;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> local_48;
  
  if (*client_data == '\0') {
    *(undefined1 *)client_data = 1;
    psVar4 = cmVariableWatch::GetAccessAsString_abi_cxx11_(access_type);
    local_258 = (pointer)local_248;
    pcVar2 = (psVar4->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_258,pcVar2,pcVar2 + psVar4->_M_string_length);
    puVar1 = (uint *)(local_198 + 0x10);
    local_198._0_8_ = puVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_198,"LISTFILE_STACK","");
    psVar4 = (string *)cmMakefile::GetProperty(mf,(string *)local_198);
    if (psVar4 == (string *)0x0) {
      psVar4 = &cmValue::Empty_abi_cxx11_;
    }
    local_238._M_allocated_capacity = (size_type)local_228;
    pcVar2 = (psVar4->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_248 + 0x10),pcVar2,pcVar2 + psVar4->_M_string_length);
    if ((uint *)local_198._0_8_ != puVar1) {
      operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
    }
    if (*(long *)((long)client_data + 0x10) == 0) {
      pcVar2 = (variable->_M_dataplus)._M_p;
      local_198._16_8_ = variable->_M_string_length;
      pcVar6 = "";
      if (newValue != (char *)0x0) {
        pcVar6 = newValue;
      }
      local_198._0_8_ = (cmMakefile *)0xa;
      local_198._8_8_ = "Variable \"";
      aStack_180._0_4_ = SUB84(pcVar2,0);
      aStack_180._4_2_ = (undefined2)((ulong)pcVar2 >> 0x20);
      aStack_180._6_2_ = (undefined2)((ulong)pcVar2 >> 0x30);
      aStack_180._8_4_ = 0x15;
      aStack_180._12_2_ = 0;
      aStack_180._M_local_buf[0xe] = '\0';
      aStack_180._M_local_buf[0xf] = '\0';
      local_170 = "\" was accessed using ";
      local_168._0_8_ = local_250;
      local_168._8_8_ = local_258;
      local_168._16_8_ = (pointer)0xd;
      pcStack_150 = " with value \"";
      local_148 = strlen(pcVar6);
      local_138 = (uint *)0x2;
      local_130 = "\".";
      views._M_len = 7;
      views._M_array = (iterator)local_198;
      local_140 = pcVar6;
      cmCatViews_abi_cxx11_(&local_a0,views);
      cmMakefile::IssueMessage(mf,LOG,&local_a0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      local_198._0_8_ = puVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_198,"CMAKE_CURRENT_LIST_FILE","");
      local_2a0 = (undefined1 *)client_data;
      psVar4 = (string *)cmMakefile::GetDefinition(mf,(string *)local_198);
      if ((uint *)local_198._0_8_ != puVar1) {
        operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
      }
      pcVar2 = (variable->_M_dataplus)._M_p;
      local_2c0 = &local_2b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2c0,pcVar2,pcVar2 + variable->_M_string_length);
      if (local_2c0 == &local_2b0) {
        aStack_180._0_4_ = uStack_2a8;
        aStack_180._4_2_ = (undefined2)uStack_2a4;
        aStack_180._6_2_ = (undefined2)((uint)uStack_2a4 >> 0x10);
        local_198._0_8_ = puVar1;
      }
      else {
        local_198._0_8_ = local_2c0;
      }
      local_198._8_8_ = local_2b8;
      local_2b8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_2b0 = local_2b0 & 0xffffff00;
      aStack_180._8_4_ = Quoted;
      local_170 = (char *)0x7fffffffffffffff;
      local_2e0 = (pointer)local_2d0;
      local_2c0 = &local_2b0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2e0,local_258,
                 (undefined1 *)
                 ((long)&(local_250->_M_dataplus)._M_p + (long)&(local_258->_M_dataplus)._M_p));
      client_data = local_2a0;
      local_168._0_8_ = local_168 + 0x10;
      if (local_2e0 == (pointer)local_2d0) {
        pcStack_150 = (char *)local_2d0._8_8_;
      }
      else {
        local_168._0_8_ = local_2e0;
      }
      local_168._8_8_ = local_2d8;
      local_2d8 = (pointer)0x0;
      local_2d0[0] = 0;
      local_148 = CONCAT44(local_148._4_4_,1);
      local_140 = (char *)0x7fffffffffffffff;
      pcVar6 = "";
      if (newValue != (char *)0x0) {
        pcVar6 = newValue;
      }
      local_300 = &local_2f0;
      local_2e0 = (pointer)local_2d0;
      local_1e0 = mf;
      sVar5 = strlen(pcVar6);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,pcVar6,pcVar6 + sVar5);
      local_138 = local_128;
      if (local_300 == &local_2f0) {
        uStack_120 = uStack_2e8;
        uStack_11c = uStack_2e4;
      }
      else {
        local_138 = local_300;
      }
      local_130 = local_2f8;
      local_2f8 = (char *)0x0;
      local_2f0 = local_2f0 & 0xffffff00;
      local_118 = 1;
      local_110 = 0x7fffffffffffffff;
      if (psVar4 == (string *)0x0) {
        psVar4 = &cmValue::Empty_abi_cxx11_;
      }
      pcVar2 = (psVar4->_M_dataplus)._M_p;
      local_300 = &local_2f0;
      local_278 = &local_268;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_278,pcVar2,pcVar2 + psVar4->_M_string_length);
      local_108 = local_f8;
      if (local_278 == &local_268) {
        uStack_f0 = uStack_260;
        uStack_ec = uStack_25c;
      }
      else {
        local_108 = local_278;
      }
      local_100 = local_270;
      local_270 = 0;
      local_268 = local_268 & 0xffffff00;
      local_e8 = 1;
      local_e0 = 0x7fffffffffffffff;
      local_298 = (long *)&local_288;
      local_278 = &local_268;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,local_238._M_allocated_capacity,
                 local_238._8_8_ + local_238._M_allocated_capacity);
      plVar8 = &local_c8;
      if (local_298 == (long *)&local_288) {
        uStack_c0 = uStack_280;
        local_d8 = plVar8;
      }
      else {
        local_d8 = local_298;
      }
      local_d0 = local_290;
      local_290 = 0;
      local_288 = 0;
      local_b8 = 1;
      local_b0 = 0x7fffffffffffffff;
      __l._M_len = 5;
      __l._M_array = (iterator)local_198;
      local_298 = (long *)&local_288;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::vector
                (&local_218,__l,(allocator_type *)&local_a0);
      lVar7 = -0xf0;
      do {
        if (plVar8 != (long *)plVar8[-2]) {
          operator_delete((long *)plVar8[-2],*plVar8 + 1);
        }
        plVar8 = plVar8 + -6;
        lVar7 = lVar7 + 0x30;
      } while (lVar7 != 0);
      if (local_298 != (long *)&local_288) {
        operator_delete(local_298,CONCAT71(uStack_287,local_288) + 1);
      }
      if (local_278 != &local_268) {
        operator_delete(local_278,CONCAT44(uStack_264,local_268) + 1);
      }
      if (local_300 != &local_2f0) {
        operator_delete(local_300,CONCAT44(uStack_2ec,local_2f0) + 1);
      }
      if (local_2e0 != (pointer)local_2d0) {
        operator_delete(local_2e0,CONCAT71(local_2d0._1_7_,local_2d0[0]) + 1);
      }
      if (local_2c0 != &local_2b0) {
        operator_delete(local_2c0,CONCAT44(uStack_2ac,local_2b0) + 1);
      }
      local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1b8,*(long *)((long)client_data + 8),
                 *(long *)((long)client_data + 0x10) + *(long *)((long)client_data + 8));
      local_48.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_218.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_start;
      local_48.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_218.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      local_48.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_218.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_218.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_218.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_218.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_a0._M_dataplus._M_p = (pointer)0x7fffffffffffffff;
      local_1d8._M_dataplus._M_p = (pointer)0x7fffffffffffffff;
      local_198._0_8_ = (pointer)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<cmListFileFunction::Implementation,std::allocator<cmListFileFunction::Implementation>,std::__cxx11::string,long&,long&,std::vector<cmListFileArgument,std::allocator<cmListFileArgument>>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_198 + 8),
                 (Implementation **)local_198,
                 (allocator<cmListFileFunction::Implementation> *)&local_301,&local_1b8,
                 (long *)&local_a0,(long *)&local_1d8,&local_48);
      local_1f8.Impl.
      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)local_198._0_8_;
      local_1f8.Impl.
      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_;
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_48);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
        operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
      }
      local_198._0_8_ = local_1e0;
      aStack_180._0_4_ = 0x6e6b6e75;
      aStack_180._4_2_ = 0x776f;
      aStack_180._6_2_ = 0x206e;
      aStack_180._8_4_ = 0x6f727265;
      aStack_180._12_2_ = 0x2e72;
      local_198._16_8_ = 0xe;
      aStack_180._M_local_buf[0xe] = '\0';
      local_168._0_8_ = (pointer)0x0;
      local_168._8_8_ = (pointer)0x0;
      local_168._16_8_ = (pointer)0x0;
      local_170 = (char *)((ulong)local_170 & 0xffffffff00000000);
      local_50 = false;
      local_198._8_8_ = &aStack_180;
      bVar3 = cmMakefile::ExecuteCommand
                        (local_1e0,&local_1f8,(cmExecutionStatus *)local_198,
                         (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_70);
      if (local_50 == true) {
        local_50 = false;
        if (local_70._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_70._M_value + 0x10)) {
          operator_delete((void *)local_70._M_value._M_dataplus._M_p,local_70._16_8_ + 1);
        }
      }
      if (!bVar3) {
        local_a0.field_2._8_8_ = *(undefined8 *)((long)client_data + 8);
        local_a0.field_2._M_allocated_capacity = *(size_type *)((long)client_data + 0x10);
        local_a0._M_dataplus._M_p = (pointer)0x56;
        local_a0._M_string_length = 0x6c310e;
        local_80 = 2;
        local_78 = "\".";
        views_00._M_len = 3;
        views_00._M_array = (iterator)&local_a0;
        cmCatViews_abi_cxx11_(&local_1d8,views_00);
        cmSystemTools::Error(&local_1d8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._8_8_ != &aStack_180) {
        operator_delete((void *)local_198._8_8_,
                        CONCAT26(aStack_180._6_2_,CONCAT24(aStack_180._4_2_,aStack_180._0_4_)) + 1);
      }
      if (local_1f8.Impl.
          super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_1f8.Impl.
                   super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&local_218);
    }
    *(undefined1 *)client_data = 0;
    if ((long *)local_238._M_allocated_capacity != local_228) {
      operator_delete((void *)local_238._M_allocated_capacity,local_228[0] + 1);
    }
    if (local_258 != (pointer)local_248) {
      operator_delete(local_258,(ulong)(local_248._0_8_ + 1));
    }
  }
  return;
}

Assistant:

void cmVariableWatchCommandVariableAccessed(const std::string& variable,
                                            int access_type, void* client_data,
                                            const char* newValue,
                                            const cmMakefile* mf)
{
  cmVariableWatchCallbackData* data =
    static_cast<cmVariableWatchCallbackData*>(client_data);

  if (data->InCallback) {
    return;
  }
  data->InCallback = true;

  auto accessString = cmVariableWatch::GetAccessAsString(access_type);

  /// Ultra bad!!
  cmMakefile* makefile = const_cast<cmMakefile*>(mf);

  std::string stack = *mf->GetProperty("LISTFILE_STACK");
  if (!data->Command.empty()) {
    cmValue const currentListFile =
      mf->GetDefinition("CMAKE_CURRENT_LIST_FILE");
    const auto fakeLineNo =
      std::numeric_limits<decltype(cmListFileArgument::Line)>::max();

    std::vector<cmListFileArgument> newLFFArgs{
      { variable, cmListFileArgument::Quoted, fakeLineNo },
      { accessString, cmListFileArgument::Quoted, fakeLineNo },
      { newValue ? newValue : "", cmListFileArgument::Quoted, fakeLineNo },
      { *currentListFile, cmListFileArgument::Quoted, fakeLineNo },
      { stack, cmListFileArgument::Quoted, fakeLineNo }
    };

    cmListFileFunction newLFF{ data->Command, fakeLineNo, fakeLineNo,
                               std::move(newLFFArgs) };
    cmExecutionStatus status(*makefile);
    if (!makefile->ExecuteCommand(newLFF, status)) {
      cmSystemTools::Error(
        cmStrCat("Error in cmake code at\nUnknown:0:\nA command failed "
                 "during the invocation of callback \"",
                 data->Command, "\"."));
    }
  } else {
    makefile->IssueMessage(
      MessageType::LOG,
      cmStrCat("Variable \"", variable, "\" was accessed using ", accessString,
               " with value \"", (newValue ? newValue : ""), "\"."));
  }

  data->InCallback = false;
}